

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z2_Nx8_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left,int upsample_above,
               int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  long lVar10;
  undefined1 auVar11 [32];
  ushort uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long in_RCX;
  long in_RDX;
  undefined2 in_SI;
  undefined6 in_register_00000032;
  int in_EDI;
  undefined2 in_R8W;
  undefined6 in_register_00000082;
  uint in_R9D;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte bStack0000000000000008;
  __m128i mask128;
  __m128i base_y_c128;
  __m128i y_c128;
  int16_t base_y_c [16];
  __m128i shifty;
  __m128i a1_y;
  __m128i a0_y;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  __m128i ydx;
  __m128i r6;
  __m128i resxy;
  __m128i resy;
  __m128i resx;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  __m128i dy128;
  __m128i c1234;
  __m128i c3f;
  __m128i min_base_y128;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i a1_x;
  __m256i a0_x;
  __m256i a16;
  __m256i a32;
  __m256i diff;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  short local_aa0;
  short sStack_a9e;
  short sStack_a9c;
  short sStack_a9a;
  short sStack_a98;
  short sStack_a96;
  short sStack_a94;
  short sStack_a92;
  undefined1 local_a70 [16];
  int local_a40;
  int local_a3c;
  undefined8 local_a10;
  undefined1 local_a00 [16];
  undefined1 local_9e0 [32];
  undefined1 auStack_9b0 [16];
  int local_964;
  ulong local_920;
  ulong local_910;
  undefined1 local_900 [32];
  undefined1 local_8e0 [140];
  ushort local_854;
  byte local_84c;
  undefined8 *local_830;
  undefined8 uStack_590;
  undefined8 uStack_588;
  
  local_830 = (undefined8 *)CONCAT62(in_register_00000032,in_SI);
  lVar10 = CONCAT62(in_register_00000082,in_R8W);
  local_84c = (byte)in_R9D;
  iVar15 = -(1 << (local_84c & 0x1f));
  uVar13 = -(1 << (bStack0000000000000008 & 0x1f));
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  auVar1 = vpinsrw_avx(auVar1,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  uStack_590 = auVar2._0_8_;
  uStack_588 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar2 = vpinsrw_avx(auVar2,0x3f,2);
  auVar2 = vpinsrw_avx(auVar2,0x3f,3);
  auVar2 = vpinsrw_avx(auVar2,0x3f,4);
  auVar2 = vpinsrw_avx(auVar2,0x3f,5);
  auVar2 = vpinsrw_avx(auVar2,0x3f,6);
  auVar2 = vpinsrw_avx(auVar2,0x3f,7);
  local_854 = (ushort)uVar13;
  auVar3 = vpinsrw_avx(ZEXT216(local_854),uVar13 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar13 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar13 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar13 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar13 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar13 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar13 & 0xffff,7);
  auVar4 = vpinsrw_avx(ZEXT216((ushort)dx),dx & 0xffff,1);
  auVar4 = vpinsrw_avx(auVar4,dx & 0xffff,2);
  auVar4 = vpinsrw_avx(auVar4,dx & 0xffff,3);
  auVar4 = vpinsrw_avx(auVar4,dx & 0xffff,4);
  auVar4 = vpinsrw_avx(auVar4,dx & 0xffff,5);
  auVar4 = vpinsrw_avx(auVar4,dx & 0xffff,6);
  auVar4 = vpinsrw_avx(auVar4,dx & 0xffff,7);
  auVar5 = vpinsrw_avx(ZEXT216(1),2,1);
  auVar5 = vpinsrw_avx(auVar5,3,2);
  auVar5 = vpinsrw_avx(auVar5,4,3);
  auVar5 = vpinsrw_avx(auVar5,5,4);
  auVar5 = vpinsrw_avx(auVar5,6,5);
  auVar5 = vpinsrw_avx(auVar5,7,6);
  auVar5 = vpinsrw_avx(auVar5,8,7);
  for (local_964 = 0; local_964 < in_EDI; local_964 = local_964 + 1) {
    iVar14 = -(local_964 + 1) * upsample_left >> (6 - local_84c & 0x1f);
    local_a3c = 0;
    if (iVar14 < iVar15 + -1) {
      local_a3c = (iVar15 - iVar14) + -1 >> (local_84c & 0x1f);
    }
    local_a40 = (int)((iVar15 - iVar14) + in_R9D) >> (local_84c & 0x1f);
    if (local_a40 < 9) {
      if (local_a40 < 0) {
        local_a40 = 0;
      }
    }
    else {
      local_a40 = 8;
    }
    if (local_a3c < 8) {
      auVar17 = *(undefined1 (*) [16])(in_RCX + iVar14 + (long)local_a3c);
      uVar12 = (short)(local_964 + 1) * (short)upsample_left;
      auVar19 = vpinsrw_avx(ZEXT216(uVar12),(uint)uVar12,1);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar12,2);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar12,3);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar12,4);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar12,5);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar12,6);
      auVar19 = vpinsrw_avx(auVar19,(uint)uVar12,7);
      auVar16 = vpsrldq_avx(auVar5,2);
      auVar16 = vpsllw_avx(auVar16,ZEXT416(6));
      if (in_R9D == 0) {
        auVar18 = vpsrldq_avx(auVar17,1);
        auVar17 = vpshufb_avx(auVar17,(undefined1  [16])LoadMaskx[local_a3c]);
        local_910 = auVar17._0_8_;
        auVar17 = vpshufb_avx(auVar18,(undefined1  [16])LoadMaskx[local_a3c]);
        local_920 = auVar17._0_8_;
        auVar19 = vpsubw_avx(auVar16,auVar19);
        auVar19 = vpand_avx(auVar19,auVar2);
        auVar19 = vpsrlw_avx(auVar19,ZEXT416(1));
      }
      else {
        auVar17 = vpshufb_avx(auVar17,(undefined1  [16])EvenOddMaskx[local_a3c]);
        local_910 = auVar17._0_8_;
        auVar17 = vpsrldq_avx(auVar17,8);
        local_920 = auVar17._0_8_;
        auVar19 = vpsubw_avx(auVar16,auVar19);
        auVar19 = vpsllw_avx(auVar19,ZEXT416(in_R9D));
        auVar19 = vpand_avx(auVar19,auVar2);
        auVar19 = vpsrlw_avx(auVar19,ZEXT416(1));
      }
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_910;
      local_8e0._0_16_ = vpmovzxbw_avx(auVar16);
      local_8e0._16_16_ = auVar19;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_920;
      auVar16 = vpmovzxbw_avx(auVar17);
    }
    else {
      local_8e0._0_16_ = ZEXT816(0);
      local_8e0._0_32_ = ZEXT1632(local_8e0._0_16_);
      local_900._0_16_ = ZEXT816(0);
      local_9e0._0_16_ = ZEXT816(0);
      auVar19 = local_9e0._0_16_;
      auVar16 = local_900._0_16_;
    }
    local_9e0 = ZEXT1632(auVar19);
    local_900 = ZEXT1632(auVar16);
    if (iVar14 < iVar15) {
      uVar13 = local_964 << 6;
      auVar17 = vpinsrw_avx(ZEXT216((ushort)uVar13),uVar13 & 0xffff,1);
      auVar17 = vpinsrw_avx(auVar17,uVar13 & 0xffff,2);
      auVar17 = vpinsrw_avx(auVar17,uVar13 & 0xffff,3);
      auVar17 = vpinsrw_avx(auVar17,uVar13 & 0xffff,4);
      auVar17 = vpinsrw_avx(auVar17,uVar13 & 0xffff,5);
      auVar17 = vpinsrw_avx(auVar17,uVar13 & 0xffff,6);
      auVar17 = vpinsrw_avx(auVar17,uVar13 & 0xffff,7);
      auVar18 = vpmullw_avx(auVar5,auVar4);
      auVar7 = vpsubw_avx(auVar17,auVar18);
      auVar18 = vpsraw_avx(auVar7,ZEXT416(6 - _bStack0000000000000008));
      auVar17 = vpcmpgtw_avx(auVar3,auVar18);
      auVar17 = vpandn_avx(auVar17,auVar18);
      sStack_a9a = auVar17._6_2_;
      sStack_a9c = auVar17._4_2_;
      sStack_a9e = auVar17._2_2_;
      local_aa0 = auVar17._0_2_;
      sStack_a92 = auVar17._14_2_;
      sStack_a94 = auVar17._12_2_;
      sStack_a96 = auVar17._10_2_;
      sStack_a98 = auVar17._8_2_;
      auVar18 = vpinsrw_avx(ZEXT116(*(byte *)(lVar10 + local_aa0)),
                            (uint)*(byte *)(lVar10 + sStack_a9e),1);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(byte *)(lVar10 + sStack_a9c),2);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(byte *)(lVar10 + sStack_a9a),3);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(byte *)(lVar10 + sStack_a98),4);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(byte *)(lVar10 + sStack_a96),5);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(byte *)(lVar10 + sStack_a94),6);
      auVar18 = vpinsrw_avx(auVar18,(uint)*(byte *)(lVar10 + sStack_a92),7);
      auVar6 = vpsrlw_avx(auVar1,ZEXT416(4));
      auVar17 = vpaddw_avx(auVar17,auVar6);
      sStack_a9a = auVar17._6_2_;
      sStack_a9c = auVar17._4_2_;
      sStack_a9e = auVar17._2_2_;
      local_aa0 = auVar17._0_2_;
      sStack_a92 = auVar17._14_2_;
      sStack_a94 = auVar17._12_2_;
      sStack_a96 = auVar17._10_2_;
      sStack_a98 = auVar17._8_2_;
      auVar17 = vpinsrw_avx(ZEXT116(*(byte *)(lVar10 + local_aa0)),
                            (uint)*(byte *)(lVar10 + sStack_a9e),1);
      auVar17 = vpinsrw_avx(auVar17,(uint)*(byte *)(lVar10 + sStack_a9c),2);
      auVar17 = vpinsrw_avx(auVar17,(uint)*(byte *)(lVar10 + sStack_a9a),3);
      auVar17 = vpinsrw_avx(auVar17,(uint)*(byte *)(lVar10 + sStack_a98),4);
      auVar17 = vpinsrw_avx(auVar17,(uint)*(byte *)(lVar10 + sStack_a96),5);
      auVar17 = vpinsrw_avx(auVar17,(uint)*(byte *)(lVar10 + sStack_a94),6);
      auVar17 = vpinsrw_avx(auVar17,(uint)*(byte *)(lVar10 + sStack_a92),7);
      if (_bStack0000000000000008 == 0) {
        auVar6 = vpand_avx(auVar7,auVar2);
        local_a70 = vpsrlw_avx(auVar6,ZEXT416(1));
      }
      else {
        auVar6 = vpsllw_avx(auVar7,ZEXT416(_bStack0000000000000008));
        auVar6 = vpand_avx(auVar6,auVar2);
        local_a70 = vpsrlw_avx(auVar6,ZEXT416(1));
      }
      auVar6 = local_8e0._16_16_;
      local_8e0._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * local_8e0._0_16_;
      local_8e0._16_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar18;
      local_900._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar16;
      local_900._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * auVar17;
      local_9e0._0_16_ = ZEXT116(0) * local_a70 + ZEXT116(1) * auVar19;
      local_9e0._16_16_ = ZEXT116(1) * local_a70;
    }
    auVar9 = vpsubw_avx2(local_900,local_8e0._0_32_);
    auVar8 = vpsllw_avx2(local_8e0._0_32_,ZEXT416(5));
    auVar11._16_8_ = uStack_590;
    auVar11._0_16_ = auVar1;
    auVar11._24_8_ = uStack_588;
    auVar8 = vpaddw_avx2(auVar8,auVar11);
    auVar9 = vpmullw_avx2(auVar9,local_9e0);
    auVar8 = vpaddw_avx2(auVar8,auVar9);
    auVar8 = vpsrlw_avx2(auVar8,ZEXT416(5));
    vpackuswb_avx(auVar8._0_16_,auVar8._0_16_);
    auStack_9b0 = auVar8._16_16_;
    local_a00 = vpackuswb_avx(local_a00,local_a00);
    auVar19 = vpblendvb_avx(auStack_9b0,local_a00,*(undefined1 (*) [16])BaseMask[local_a40]);
    local_a10 = auVar19._0_8_;
    *local_830 = local_a10;
    local_830 = (undefined8 *)(in_RDX + (long)local_830);
  }
  return;
}

Assistant:

static void dr_prediction_z2_Nx8_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                      const uint8_t *above, const uint8_t *left,
                                      int upsample_above, int upsample_left,
                                      int dx, int dy) {
  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i diff, a32, a16;
  __m256i a0_x, a1_x;
  __m128i a0_x128, a1_x128, min_base_y128, c3f;
  __m128i c1234, dy128;

  a16 = _mm256_set1_epi16(16);
  c3f = _mm_set1_epi16(0x3f);
  min_base_y128 = _mm_set1_epi16(min_base_y);
  dy128 = _mm_set1_epi16(dy);
  c1234 = _mm_setr_epi16(1, 2, 3, 4, 5, 6, 7, 8);

  for (int r = 0; r < N; r++) {
    __m256i b, res, shift;
    __m128i resx, resy, resxy, r6, ydx;

    int y = r + 1;
    int base_x = (-y * dx) >> frac_bits_x;
    int base_shift = 0;
    if (base_x < (min_base_x - 1)) {
      base_shift = (min_base_x - base_x - 1) >> upsample_above;
    }
    int base_min_diff =
        (min_base_x - base_x + upsample_above) >> upsample_above;
    if (base_min_diff > 8) {
      base_min_diff = 8;
    } else {
      if (base_min_diff < 0) base_min_diff = 0;
    }

    if (base_shift > 7) {
      a0_x = _mm256_setzero_si256();
      a1_x = _mm256_setzero_si256();
      shift = _mm256_setzero_si256();
    } else {
      a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
      ydx = _mm_set1_epi16(y * dx);
      r6 = _mm_slli_epi16(_mm_srli_si128(c1234, 2), 6);
      if (upsample_above) {
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)EvenOddMaskx[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 8);

        shift = _mm256_castsi128_si256(_mm_srli_epi16(
            _mm_and_si128(
                _mm_slli_epi16(_mm_sub_epi16(r6, ydx), upsample_above), c3f),
            1));
      } else {
        a1_x128 = _mm_srli_si128(a0_x128, 1);
        a0_x128 = _mm_shuffle_epi8(a0_x128, *(__m128i *)LoadMaskx[base_shift]);
        a1_x128 = _mm_shuffle_epi8(a1_x128, *(__m128i *)LoadMaskx[base_shift]);

        shift = _mm256_castsi128_si256(
            _mm_srli_epi16(_mm_and_si128(_mm_sub_epi16(r6, ydx), c3f), 1));
      }
      a0_x = _mm256_castsi128_si256(_mm_cvtepu8_epi16(a0_x128));
      a1_x = _mm256_castsi128_si256(_mm_cvtepu8_epi16(a1_x128));
    }

    // y calc
    __m128i a0_y, a1_y, shifty;
    if (base_x < min_base_x) {
      DECLARE_ALIGNED(32, int16_t, base_y_c[16]);
      __m128i y_c128, base_y_c128, mask128;
      r6 = _mm_set1_epi16(r << 6);
      y_c128 = _mm_sub_epi16(r6, _mm_mullo_epi16(c1234, dy128));
      base_y_c128 = _mm_srai_epi16(y_c128, frac_bits_y);
      mask128 = _mm_cmpgt_epi16(min_base_y128, base_y_c128);
      base_y_c128 = _mm_andnot_si128(mask128, base_y_c128);
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);

      a0_y = _mm_setr_epi16(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]],
                            left[base_y_c[4]], left[base_y_c[5]],
                            left[base_y_c[6]], left[base_y_c[7]]);
      base_y_c128 = _mm_add_epi16(
          base_y_c128, _mm_srli_epi16(_mm256_castsi256_si128(a16), 4));
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);

      a1_y = _mm_setr_epi16(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]],
                            left[base_y_c[4]], left[base_y_c[5]],
                            left[base_y_c[6]], left[base_y_c[7]]);

      if (upsample_left) {
        shifty = _mm_srli_epi16(
            _mm_and_si128(_mm_slli_epi16(y_c128, upsample_left), c3f), 1);
      } else {
        shifty = _mm_srli_epi16(_mm_and_si128(y_c128, c3f), 1);
      }

      a0_x = _mm256_inserti128_si256(a0_x, a0_y, 1);
      a1_x = _mm256_inserti128_si256(a1_x, a1_y, 1);
      shift = _mm256_inserti128_si256(shift, shifty, 1);
    }

    diff = _mm256_sub_epi16(a1_x, a0_x);  // a[x+1] - a[x]
    a32 = _mm256_slli_epi16(a0_x, 5);     // a[x] * 32
    a32 = _mm256_add_epi16(a32, a16);     // a[x] * 32 + 16

    b = _mm256_mullo_epi16(diff, shift);
    res = _mm256_add_epi16(a32, b);
    res = _mm256_srli_epi16(res, 5);

    resx = _mm_packus_epi16(_mm256_castsi256_si128(res),
                            _mm256_castsi256_si128(res));
    resy = _mm256_extracti128_si256(res, 1);
    resy = _mm_packus_epi16(resy, resy);

    resxy = _mm_blendv_epi8(resx, resy, *(__m128i *)BaseMask[base_min_diff]);
    _mm_storel_epi64((__m128i *)(dst), resxy);
    dst += stride;
  }
}